

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall luna::String::SetValue(String *this,char *str,size_t len)

{
  char *pcVar1;
  ulong in_RDX;
  void *in_RSI;
  String *in_RDI;
  
  if (((in_RDI->super_GCObject).field_0x11 != '\0') && ((in_RDI->field_1).str_ != (char *)0x0)) {
    operator_delete__((in_RDI->field_1).str_);
  }
  in_RDI->length_ = (uint)in_RDX;
  if (in_RDX < 0xb) {
    memcpy(&in_RDI->field_1,in_RSI,in_RDX);
    (in_RDI->field_1).str_buffer_[in_RDX] = '\0';
    (in_RDI->super_GCObject).field_0x11 = 0;
    Hash(in_RDI,(in_RDI->field_1).str_buffer_);
  }
  else {
    pcVar1 = (char *)operator_new__(in_RDX + 1);
    (in_RDI->field_1).str_ = pcVar1;
    memcpy((in_RDI->field_1).str_,in_RSI,in_RDX);
    (in_RDI->field_1).str_[in_RDX] = '\0';
    (in_RDI->super_GCObject).field_0x11 = 1;
    Hash(in_RDI,(in_RDI->field_1).str_);
  }
  return;
}

Assistant:

void String::SetValue(const char *str, std::size_t len)
    {
        if (in_heap_)
            delete [] str_;

        length_ = len;
        if (len < sizeof(str_buffer_))
        {
            memcpy(str_buffer_, str, len);
            str_buffer_[len] = 0;
            in_heap_ = 0;
            Hash(str_buffer_);
        }
        else
        {
            str_ = new char[len + 1];
            memcpy(str_, str, len);
            str_[len] = 0;
            in_heap_ = 1;
            Hash(str_);
        }
    }